

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_ppt_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  uchar *puVar2;
  jpc_ppt_t *ppt;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  (ms->parms).siz.height = 0;
  if ((ms->len == 0) || (iVar1 = jpc_getuint8(in,(uint_fast8_t *)&(ms->parms).soc), iVar1 != 0)) {
LAB_00128bec:
    jpc_ppt_destroyparms(ms);
    ms_local._4_4_ = -1;
  }
  else {
    (ms->parms).poc.pchgs = (jpc_pocpchg_t *)(ms->len - 1);
    if ((ms->parms).sot.len == 0) {
      (ms->parms).siz.height = 0;
    }
    else {
      puVar2 = (uchar *)jas_malloc((ms->parms).sot.len);
      (ms->parms).ppm.data = puVar2;
      if ((puVar2 == (uchar *)0x0) ||
         (iVar1 = jas_stream_read(in,(ms->parms).ppm.data,(uint)(ms->parms).sot.len),
         iVar1 != (int)(ms->parms).sot.len)) goto LAB_00128bec;
    }
    ms_local._4_4_ = 0;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_ppt_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_ppt_t *ppt = &ms->parms.ppt;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	ppt->data = 0;

	if (ms->len < 1) {
		goto error;
	}
	if (jpc_getuint8(in, &ppt->ind)) {
		goto error;
	}
	ppt->len = ms->len - 1;
	if (ppt->len > 0) {
		if (!(ppt->data = jas_malloc(ppt->len))) {
			goto error;
		}
		if (jas_stream_read(in, (char *) ppt->data, ppt->len) != JAS_CAST(int, ppt->len)) {
			goto error;
		}
	} else {
		ppt->data = 0;
	}
	return 0;

error:
	jpc_ppt_destroyparms(ms);
	return -1;
}